

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

int fmt::v7::detail::
    parse_nonnegative_int<char,fmt::v7::detail::width_adapter<fmt::v7::detail::specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>>&,char>&>
              (char **begin,char *end,
              width_adapter<fmt::v7::detail::specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_>_&,_char>
              *eh)

{
  char *pcVar1;
  uint uVar2;
  char *pcVar3;
  
  if ((*begin == end) || (9 < (byte)(**begin - 0x30U))) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/fmt/include/fmt/format.h"
                ,0x800,"");
  }
  uVar2 = 0;
  pcVar1 = *begin;
  while (pcVar3 = pcVar1 + 1, uVar2 < 0xccccccd) {
    uVar2 = ((int)*pcVar1 + uVar2 * 10) - 0x30;
    *begin = pcVar3;
    if ((pcVar3 == end) || (pcVar1 = pcVar3, 9 < (byte)(*pcVar3 - 0x30U))) goto LAB_003f8f20;
  }
  uVar2 = 0x80000000;
LAB_003f8f20:
  if ((int)uVar2 < 0) {
    error_handler::on_error((error_handler *)begin,"number is too big");
  }
  return uVar2;
}

Assistant:

FMT_CONSTEXPR int parse_nonnegative_int(const Char*& begin, const Char* end,
                                        ErrorHandler&& eh) {
  FMT_ASSERT(begin != end && '0' <= *begin && *begin <= '9', "");
  unsigned value = 0;
  // Convert to unsigned to prevent a warning.
  constexpr unsigned max_int = max_value<int>();
  unsigned big = max_int / 10;
  do {
    // Check for overflow.
    if (value > big) {
      value = max_int + 1;
      break;
    }
    value = value * 10 + unsigned(*begin - '0');
    ++begin;
  } while (begin != end && '0' <= *begin && *begin <= '9');
  if (value > max_int) eh.on_error("number is too big");
  return static_cast<int>(value);
}